

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

void __thiscall asmjit::JitRuntime::JitRuntime(JitRuntime *this)

{
  VMemMgr *in_RDI;
  VMemMgr *this_00;
  
  this_00 = in_RDI;
  HostRuntime::HostRuntime((HostRuntime *)in_RDI);
  (in_RDI->_lock)._handle.__align = (long)&PTR__JitRuntime_002c2c08;
  VMemMgr::VMemMgr(this_00);
  return;
}

Assistant:

JitRuntime::JitRuntime() noexcept {}